

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_cnttzw(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGv_i32 ret;
  uintptr_t o;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_ppc64
            (tcg_ctx,ret,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)));
  tcg_gen_ctzi_i32_ppc64(tcg_ctx,ret,ret,0x20);
  tcg_gen_extu_i32_i64_ppc64(tcg_ctx,cpu_gpr[*(ushort *)((long)&ctx->opcode + 2) & 0x1f],ret);
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  if ((ctx->opcode & 1) == 0) {
    return;
  }
  gen_set_Rc0(ctx,*(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0xd & 0xf8)));
  return;
}

Assistant:

static void gen_cnttzw(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv_i32 t = tcg_temp_new_i32(tcg_ctx);

    tcg_gen_trunc_tl_i32(tcg_ctx, t, cpu_gpr[rS(ctx->opcode)]);
    tcg_gen_ctzi_i32(tcg_ctx, t, t, 32);
    tcg_gen_extu_i32_tl(tcg_ctx, cpu_gpr[rA(ctx->opcode)], t);
    tcg_temp_free_i32(tcg_ctx, t);

    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_Rc0(ctx, cpu_gpr[rA(ctx->opcode)]);
    }
}